

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

string * __thiscall
kratos::expr_to_string_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,Expr *expr,bool is_top,bool use_handle,
          bool ignore_top,Generator *scope)

{
  undefined1 *puVar1;
  long *plVar2;
  bool bVar3;
  ExprOp extraout_RDX;
  ExprOp extraout_RDX_00;
  ExprOp extraout_RDX_01;
  ExprOp extraout_RDX_02;
  ExprOp extraout_RDX_03;
  ExprOp extraout_RDX_04;
  ExprOp extraout_RDX_05;
  ExprOp extraout_RDX_06;
  ExprOp extraout_RDX_07;
  ExprOp extraout_RDX_08;
  ExprOp extraout_RDX_09;
  ExprOp extraout_RDX_10;
  ExprOp EVar4;
  undefined8 uVar5;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar7;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  undefined8 in_stack_ffffffffffffff18;
  string left_str;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  pointer ppStack_b0;
  _func_int **local_a8;
  pointer pcStack_a0;
  undefined1 local_98 [32];
  long *local_78;
  _Alloc_hider local_70;
  _Hash_node_base *local_68;
  undefined1 local_5c;
  undefined1 auStack_58 [8];
  string right_str;
  
  aVar6._1_7_ = in_register_00000089;
  aVar6._0_1_ = ignore_top;
  _local_5c = SUB84(expr,0);
  aVar7 = aVar6;
  right_str.field_2._8_8_ = __return_storage_ptr__;
  bVar3 = is_expand_op(*(ExprOp *)(this + 0x270));
  uVar5 = right_str.field_2._8_8_;
  if (bVar3) {
    if (is_top) {
      (**(code **)(*(long *)this + 0x108))(right_str.field_2._8_8_,this,use_handle);
    }
    else if (aVar6.values_ ==
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0) {
      (**(code **)(*(long *)this + 0xf8))(right_str.field_2._8_8_,this);
    }
    else {
      (**(code **)(*(long *)this + 0x110))(right_str.field_2._8_8_,this,aVar6.values_);
    }
  }
  else {
    if (*(long *)(this + 0x270) == 0x1b) {
      if (is_top) {
        (**(code **)(*(long *)this + 0x108))
                  ((undefined1 *)((long)&left_str.field_2 + 8),this,use_handle);
      }
      else {
        puVar1 = (undefined1 *)((long)&left_str.field_2 + 8);
        if (aVar6.values_ ==
            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
            0x0) {
          (**(code **)(*(long *)this + 0xf8))(puVar1,this);
        }
        else {
          (**(code **)(*(long *)this + 0x110))(puVar1,this,aVar6.values_);
        }
      }
      uVar5 = right_str.field_2._8_8_;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x5;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar7.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&stack0xffffffffffffff18;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)right_str.field_2._8_8_,(detail *)0x24b525,format_str,args);
      left_str._M_string_length = (size_type)local_b8;
      in_stack_ffffffffffffff18 = left_str.field_2._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           **)left_str.field_2._8_8_ == &local_b8) {
        return (string *)uVar5;
      }
    }
    else {
      plVar2 = *(long **)(this + 0x278);
      local_78 = *(long **)(this + 0x280);
      if ((int)plVar2[0x2d] == 1) {
        Var::as<kratos::Expr>((Var *)((long)&left_str.field_2 + 8));
        local_70._M_p = (pointer)left_str.field_2._8_8_;
        local_68 = *(_Hash_node_base **)(this + 0x270);
        Var::as<kratos::Expr>((Var *)auStack_58);
        aVar7 = aVar6;
        expr_to_string_abi_cxx11_
                  ((string *)&stack0xffffffffffffff18,(kratos *)local_70._M_p,
                   (Expr *)(ulong)(local_68 == *(_Hash_node_base **)((long)auStack_58 + 0x270)),
                   is_top,use_handle,ignore_top,(Generator *)in_stack_ffffffffffffff18);
        EVar4 = extraout_RDX;
        if (right_str._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)right_str._M_dataplus._M_p);
          EVar4 = extraout_RDX_00;
        }
        if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
          EVar4 = extraout_RDX_01;
        }
      }
      else if (is_top) {
        (**(code **)(*plVar2 + 0x108))(&stack0xffffffffffffff18,plVar2,use_handle);
        EVar4 = extraout_RDX_02;
      }
      else if (aVar6.values_ ==
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) {
        (**(code **)(*plVar2 + 0xf8))(&stack0xffffffffffffff18,plVar2);
        EVar4 = extraout_RDX_04;
      }
      else {
        (**(code **)(*plVar2 + 0x110))(&stack0xffffffffffffff18,plVar2,aVar6.values_);
        EVar4 = extraout_RDX_03;
      }
      if (local_78 == (long *)0x0) {
        if (local_5c == '\0') {
          ExprOpStr_abi_cxx11_((string *)auStack_58,*(kratos **)(this + 0x270),EVar4);
          uVar5 = right_str.field_2._8_8_;
          left_str.field_2._8_8_ = auStack_58;
          ppStack_b0 = (pointer)left_str._M_dataplus._M_p;
          format_str_01.size_ = 0xdd;
          format_str_01.data_ = (char *)0x8;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar7.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)((long)&left_str.field_2 + 8);
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)in_stack_ffffffffffffff18;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)right_str.field_2._8_8_,(detail *)"({0}{1})",format_str_01,args_01);
        }
        else {
          ExprOpStr_abi_cxx11_((string *)auStack_58,*(kratos **)(this + 0x270),EVar4);
          uVar5 = right_str.field_2._8_8_;
          left_str.field_2._8_8_ = auStack_58;
          ppStack_b0 = (pointer)left_str._M_dataplus._M_p;
          format_str_00.size_ = 0xdd;
          format_str_00.data_ = (char *)0x6;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar7.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)((long)&left_str.field_2 + 8);
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)in_stack_ffffffffffffff18;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)right_str.field_2._8_8_,(detail *)"{0}{1}",format_str_00,args_00);
        }
      }
      else {
        if ((int)local_78[0x2d] == 1) {
          Var::as<kratos::Expr>((Var *)((long)&left_str.field_2 + 8));
          local_70._M_p = (pointer)left_str.field_2._8_8_;
          local_68 = *(_Hash_node_base **)(this + 0x270);
          Var::as<kratos::Expr>((Var *)local_98);
          expr_to_string_abi_cxx11_
                    ((string *)auStack_58,(kratos *)local_70._M_p,
                     (Expr *)(ulong)(local_68 ==
                                    (_Hash_node_base *)
                                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)(local_98._0_8_ + 0x270))->_M_allocated_capacity),is_top,
                     use_handle,ignore_top,(Generator *)in_stack_ffffffffffffff18);
          EVar4 = extraout_RDX_05;
          aVar7 = aVar6;
          if ((pointer)local_98._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
            EVar4 = extraout_RDX_06;
            aVar7 = aVar6;
          }
          if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
            EVar4 = extraout_RDX_07;
          }
        }
        else if (is_top) {
          (**(code **)(*local_78 + 0x108))(auStack_58,local_78,use_handle);
          EVar4 = extraout_RDX_08;
        }
        else if (aVar6.values_ ==
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0) {
          (**(code **)(*local_78 + 0xf8))(auStack_58);
          EVar4 = extraout_RDX_10;
        }
        else {
          (**(code **)(*local_78 + 0x110))(auStack_58,local_78,aVar6.values_);
          EVar4 = extraout_RDX_09;
        }
        if (local_5c == '\0') {
          ExprOpStr_abi_cxx11_((string *)local_98,*(kratos **)(this + 0x270),EVar4);
          uVar5 = right_str.field_2._8_8_;
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_98._0_8_;
          ppStack_b0 = (pointer)local_98._8_8_;
          local_a8 = (_func_int **)auStack_58;
          pcStack_a0 = right_str._M_dataplus._M_p;
          format_str_03.size_ = 0xddd;
          format_str_03.data_ = (char *)0xd;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar7.values_;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)((long)&left_str.field_2 + 8);
          left_str.field_2._8_8_ = in_stack_ffffffffffffff18;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)right_str.field_2._8_8_,(detail *)"({0} {1} {2})",format_str_03,
                     args_03);
        }
        else {
          ExprOpStr_abi_cxx11_((string *)local_98,*(kratos **)(this + 0x270),EVar4);
          uVar5 = right_str.field_2._8_8_;
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_98._0_8_;
          ppStack_b0 = (pointer)local_98._8_8_;
          local_a8 = (_func_int **)auStack_58;
          pcStack_a0 = right_str._M_dataplus._M_p;
          format_str_02.size_ = 0xddd;
          format_str_02.data_ = (char *)0xb;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar7.values_;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)((long)&left_str.field_2 + 8);
          left_str.field_2._8_8_ = in_stack_ffffffffffffff18;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)right_str.field_2._8_8_,(detail *)"{0} {1} {2}",format_str_02,args_02
                    );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
        }
      }
      if (auStack_58 != (undefined1  [8])&right_str._M_string_length) {
        operator_delete((void *)auStack_58,right_str._M_string_length + 1);
      }
      if ((size_type *)in_stack_ffffffffffffff18 == &left_str._M_string_length) {
        return (string *)uVar5;
      }
    }
    operator_delete((void *)in_stack_ffffffffffffff18,(ulong)(left_str._M_string_length + 1));
  }
  return (string *)uVar5;
}

Assistant:

std::string inline expr_to_string(const Expr *expr, bool is_top, bool use_handle,
                                  bool ignore_top = false, Generator *scope = nullptr) {
    // overloaded to_string methods?
    if (is_expand_op(expr->op))
        return use_handle ? expr->handle_name(ignore_top)
               : scope    ? expr->handle_name(scope)
                          : expr->to_string();
    if (expr->op == ExprOp::Conditional)
        return ::format("({0})", use_handle ? expr->handle_name(ignore_top)
                                 : scope    ? expr->handle_name(scope)
                                            : expr->to_string());

    auto *left = expr->left;
    auto *right = expr->right;

    auto left_str = left->type() == VarType::Expression
                        ? expr_to_string(left->as<Expr>().get(), expr->op == left->as<Expr>()->op,
                                         use_handle, ignore_top, scope)
                        : (use_handle ? left->handle_name(ignore_top)
                           : scope    ? left->handle_name(scope)
                                      : left->to_string());

    if (right != nullptr) {
        auto right_str =
            right->type() == VarType::Expression
                ? expr_to_string(right->as<Expr>().get(), expr->op == right->as<Expr>()->op,
                                 use_handle, ignore_top, scope)
                : (use_handle ? right->handle_name(ignore_top)
                   : scope    ? right->handle_name(scope)
                              : right->to_string());
        if (is_top)
            return ::format("{0} {1} {2}", left_str, ExprOpStr(expr->op), right_str);
        else
            return ::format("({0} {1} {2})", left_str, ExprOpStr(expr->op), right_str);
    } else {
        if (is_top)
            return ::format("{0}{1}", ExprOpStr(expr->op), left_str);
        else
            return ::format("({0}{1})", ExprOpStr(expr->op), left_str);
    }
}